

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

double __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetObservationProbability
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index jaI,Index sucSI,Index joI)

{
  pointer puVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> O;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000258;
  TwoStageDynamicBayesianNetwork *in_stack_00000260;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  double local_8;
  
  if (((ulong)in_RDI[0x18].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start & 0x10000) == 0) {
    (**(code **)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + 100))(in_RDI,in_ECX);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    (**(code **)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + 0x36))(local_50,in_RDI,in_EDX);
    (**(code **)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + 0x50))(in_RDI,in_ESI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_8 = TwoStageDynamicBayesianNetwork::GetOProbability
                        (in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
  }
  else {
    puVar1 = in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    local_8 = (double)(**(code **)(*(long *)puVar1 + 0x20))(puVar1,in_ESI,in_EDX,in_ECX);
  }
  return local_8;
}

Assistant:

double MultiAgentDecisionProcessDiscreteFactoredStates::
GetObservationProbability  (Index jaI, Index sucSI, Index joI) const
{
    if(_m_cached_FlatOM)
        return _m_p_oModel->Get(jaI, sucSI, joI);
    vector<Index> O = JointToIndividualObservationIndices(joI);
    vector<Index> Y = StateIndexToFactorValueIndices(sucSI);
    vector<Index> A = JointToIndividualActionIndices(jaI);
    return(_m_2dbn.GetOProbability(A,Y,O));    
}